

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

size_t uv__thread_stack_size(void)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  rlimit lim;
  
  iVar1 = getrlimit64(RLIMIT_STACK,(rlimit64 *)&lim);
  sVar2 = 0x200000;
  if ((iVar1 == 0) && (lim.rlim_cur != 0xffffffffffffffff)) {
    iVar1 = getpagesize();
    uVar4 = lim.rlim_cur - lim.rlim_cur % (ulong)(long)iVar1;
    lim.rlim_cur = uVar4;
    sVar3 = uv__min_stack_size();
    sVar2 = 0x200000;
    if (sVar3 <= uVar4) {
      sVar2 = lim.rlim_cur;
    }
  }
  return sVar2;
}

Assistant:

size_t uv__thread_stack_size(void) {
#if defined(__APPLE__) || defined(__linux__)
  struct rlimit lim;

  /* getrlimit() can fail on some aarch64 systems due to a glibc bug where
   * the system call wrapper invokes the wrong system call. Don't treat
   * that as fatal, just use the default stack size instead.
   */
  if (getrlimit(RLIMIT_STACK, &lim))
    return uv__default_stack_size();

  if (lim.rlim_cur == RLIM_INFINITY)
    return uv__default_stack_size();

  /* pthread_attr_setstacksize() expects page-aligned values. */
  lim.rlim_cur -= lim.rlim_cur % (rlim_t) getpagesize();

  if (lim.rlim_cur >= (rlim_t) uv__min_stack_size())
    return lim.rlim_cur;
#endif

  return uv__default_stack_size();
}